

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ForwardTypedefDeclarationSyntax::setChild
          (ForwardTypedefDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0046b61c + *(int *)(&DAT_0046b61c + index * 4)))();
  return;
}

Assistant:

void ForwardTypedefDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: typedefKeyword = child.token(); return;
        case 2: typeRestriction = child.node() ? &child.node()->as<ForwardTypeRestrictionSyntax>() : nullptr; return;
        case 3: name = child.token(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}